

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

void cmsys::SystemInformationImplementation::SetStackTraceOnError(int enable)

{
  sigaction local_c8;
  
  if (enable == 0 || (SetStackTraceOnError(int)::saOrigValid & 1) != 0) {
    if ((enable == 0 & SetStackTraceOnError(int)::saOrigValid) == 1) {
      sigaction(6,(sigaction *)&SetStackTraceOnError::saABRTOrig,(sigaction *)0x0);
      sigaction(0xb,(sigaction *)&SetStackTraceOnError::saSEGVOrig,(sigaction *)0x0);
      sigaction(0xf,(sigaction *)&SetStackTraceOnError::saTERMOrig,(sigaction *)0x0);
      sigaction(2,(sigaction *)&SetStackTraceOnError::saINTOrig,(sigaction *)0x0);
      sigaction(4,(sigaction *)&SetStackTraceOnError::saILLOrig,(sigaction *)0x0);
      sigaction(7,(sigaction *)&SetStackTraceOnError::saBUSOrig,(sigaction *)0x0);
      sigaction(8,(sigaction *)&SetStackTraceOnError::saFPEOrig,(sigaction *)0x0);
      SetStackTraceOnError(int)::saOrigValid = 0;
    }
  }
  else {
    sigaction(6,(sigaction *)0x0,(sigaction *)&SetStackTraceOnError::saABRTOrig);
    sigaction(0xb,(sigaction *)0x0,(sigaction *)&SetStackTraceOnError::saSEGVOrig);
    sigaction(0xf,(sigaction *)0x0,(sigaction *)&SetStackTraceOnError::saTERMOrig);
    sigaction(2,(sigaction *)0x0,(sigaction *)&SetStackTraceOnError::saINTOrig);
    sigaction(4,(sigaction *)0x0,(sigaction *)&SetStackTraceOnError::saILLOrig);
    sigaction(7,(sigaction *)0x0,(sigaction *)&SetStackTraceOnError::saBUSOrig);
    sigaction(8,(sigaction *)0x0,(sigaction *)&SetStackTraceOnError::saFPEOrig);
    SetStackTraceOnError(int)::saOrigValid = 1;
    local_c8.__sigaction_handler.sa_handler = anon_unknown_3::StacktraceSignalHandler;
    local_c8.sa_flags = -0x6ffffffc;
    sigemptyset(&local_c8.sa_mask);
    sigaction(6,&local_c8,(sigaction *)0x0);
    sigaction(0xb,&local_c8,(sigaction *)0x0);
    sigaction(0xf,&local_c8,(sigaction *)0x0);
    sigaction(2,&local_c8,(sigaction *)0x0);
    sigaction(4,&local_c8,(sigaction *)0x0);
    sigaction(7,&local_c8,(sigaction *)0x0);
    sigaction(8,&local_c8,(sigaction *)0x0);
  }
  return;
}

Assistant:

void SystemInformationImplementation::SetStackTraceOnError(int enable)
{
#if !defined(_WIN32) && !defined(__MINGW32__) && !defined(__CYGWIN__)
  static int saOrigValid = 0;
  static struct sigaction saABRTOrig;
  static struct sigaction saSEGVOrig;
  static struct sigaction saTERMOrig;
  static struct sigaction saINTOrig;
  static struct sigaction saILLOrig;
  static struct sigaction saBUSOrig;
  static struct sigaction saFPEOrig;

  if (enable && !saOrigValid) {
    // save the current actions
    sigaction(SIGABRT, 0, &saABRTOrig);
    sigaction(SIGSEGV, 0, &saSEGVOrig);
    sigaction(SIGTERM, 0, &saTERMOrig);
    sigaction(SIGINT, 0, &saINTOrig);
    sigaction(SIGILL, 0, &saILLOrig);
    sigaction(SIGBUS, 0, &saBUSOrig);
    sigaction(SIGFPE, 0, &saFPEOrig);

    // enable read, disable write
    saOrigValid = 1;

    // install ours
    struct sigaction sa;
    sa.sa_sigaction = (SigAction)StacktraceSignalHandler;
    sa.sa_flags = SA_SIGINFO | SA_RESETHAND;
#ifdef SA_RESTART
    sa.sa_flags |= SA_RESTART;
#endif
    sigemptyset(&sa.sa_mask);

    sigaction(SIGABRT, &sa, 0);
    sigaction(SIGSEGV, &sa, 0);
    sigaction(SIGTERM, &sa, 0);
    sigaction(SIGINT, &sa, 0);
    sigaction(SIGILL, &sa, 0);
    sigaction(SIGBUS, &sa, 0);
    sigaction(SIGFPE, &sa, 0);
  } else if (!enable && saOrigValid) {
    // restore previous actions
    sigaction(SIGABRT, &saABRTOrig, 0);
    sigaction(SIGSEGV, &saSEGVOrig, 0);
    sigaction(SIGTERM, &saTERMOrig, 0);
    sigaction(SIGINT, &saINTOrig, 0);
    sigaction(SIGILL, &saILLOrig, 0);
    sigaction(SIGBUS, &saBUSOrig, 0);
    sigaction(SIGFPE, &saFPEOrig, 0);

    // enable write, disable read
    saOrigValid = 0;
  }
#else
  // avoid warning C4100
  (void)enable;
#endif
}